

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  int iVar1;
  Expr *in_RSI;
  Expr *in_RDI;
  WhereConst *unaff_retaddr;
  Expr *pLeft;
  Expr *pRight;
  Expr *in_stack_ffffffffffffffd8;
  Parse *pParse;
  Expr *pEVar2;
  
  pEVar2 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
  if ((in_RSI != (Expr *)0x0) && ((in_RSI->flags & *(uint *)((long)&in_RDI->pRight + 4)) == 0)) {
    if (in_RSI->op == ',') {
      findConstInWhere((WhereConst *)in_RSI,(Expr *)&DAT_aaaaaaaaaaaaaaaa);
      findConstInWhere((WhereConst *)in_RSI,pEVar2);
    }
    else if (in_RSI->op == '6') {
      pEVar2 = in_RSI->pRight;
      pParse = (Parse *)in_RSI->pLeft;
      if ((pEVar2->op == 0xa8) &&
         (iVar1 = sqlite3ExprIsConstant(pParse,in_stack_ffffffffffffffd8), iVar1 != 0)) {
        constInsert(unaff_retaddr,in_RDI,in_RSI,pEVar2);
      }
      if ((*(char *)&pParse->db == -0x58) &&
         (iVar1 = sqlite3ExprIsConstant(pParse,in_stack_ffffffffffffffd8), iVar1 != 0)) {
        constInsert(unaff_retaddr,in_RDI,in_RSI,pEVar2);
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( NEVER(pExpr==0) ) return;
  if( ExprHasProperty(pExpr, pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return;
  }
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pLeft) ){
    constInsert(pConst,pRight,pLeft,pExpr);
  }
  if( pLeft->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pRight) ){
    constInsert(pConst,pLeft,pRight,pExpr);
  }
}